

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O1

anon_class_8_1_736c71da
google::protobuf::internal::ExtensionSet::
ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::MessageSetByteSize()const::__0>
          (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           begin,_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                 end,anon_class_8_1_736c71da func)

{
  size_t sVar1;
  
  if (begin._M_node != end._M_node) {
    do {
      sVar1 = Extension::MessageSetItemByteSize
                        ((Extension *)&begin._M_node[1]._M_parent,begin._M_node[1]._M_color);
      *func.total_size = *func.total_size + sVar1;
      begin._M_node = (_Base_ptr)std::_Rb_tree_increment(begin._M_node);
    } while (begin._M_node != end._M_node);
  }
  return (anon_class_8_1_736c71da)func.total_size;
}

Assistant:

static KeyValueFunctor ForEach(Iterator begin, Iterator end,
                                 KeyValueFunctor func) {
    for (Iterator it = begin; it != end; ++it) func(it->first, it->second);
    return std::move(func);
  }